

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_suite.cpp
# Opt level: O3

void basic_suite::run(void)

{
  undefined8 local_38;
  undefined4 local_2c;
  
  test_null();
  local_38 = 0;
  local_2c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value<token::null>()","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/encoder_suite.cpp"
             ,0x2c,"void basic_suite::fail_null_empty()",&local_38,&local_2c);
  test_false();
  local_38 = 0;
  local_2c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value(false)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/encoder_suite.cpp"
             ,0x3c,"void basic_suite::fail_false_empty()",&local_38,&local_2c);
  test_true();
  local_38 = 0;
  local_2c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value(true)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/encoder_suite.cpp"
             ,0x4c,"void basic_suite::fail_true_empty()",&local_38,&local_2c);
  return;
}

Assistant:

void run()
{
    test_null();
    fail_null_empty();
    test_false();
    fail_false_empty();
    test_true();
    fail_true_empty();
}